

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O0

void Cgt_SimulationRecord(Cgt_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  uint *p_00;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Cgt_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pPart->vObjs), local_1c < iVar1; local_1c = local_1c + 1
      ) {
    pvVar2 = Vec_PtrEntry(p->pPart->vObjs,local_1c);
    if ((pvVar2 != (void *)0x0) &&
       (iVar1 = sat_solver_var_value(p->pSat,p->pCnf->pVarNums[local_1c]), iVar1 != 0)) {
      p_00 = (uint *)Vec_PtrEntry(p->vPatts,local_1c);
      Abc_InfoSetBit(p_00,p->nPatts);
    }
  }
  p->nPatts = p->nPatts + 1;
  if (p->nPatts == p->nPattWords << 5) {
    Vec_PtrReallocSimInfo(p->vPatts);
    Vec_PtrCleanSimInfo(p->vPatts,p->nPattWords,p->nPattWords << 1);
    p->nPattWords = p->nPattWords << 1;
  }
  return;
}

Assistant:

void Cgt_SimulationRecord( Cgt_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pPart, pObj, i )
        if ( sat_solver_var_value( p->pSat, p->pCnf->pVarNums[i] ) )
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPatts, i), p->nPatts );
    p->nPatts++;
    if ( p->nPatts == 32 * p->nPattWords )
    {
        Vec_PtrReallocSimInfo( p->vPatts );
        Vec_PtrCleanSimInfo( p->vPatts, p->nPattWords, 2 * p->nPattWords );
        p->nPattWords *= 2;
    }
}